

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O3

bool __thiscall duckdb::ErrorData::operator==(ErrorData *this,ErrorData *other)

{
  size_t __n;
  int iVar1;
  
  if (((this->initialized == other->initialized) && (this->type == other->type)) &&
     (__n = (this->raw_message)._M_string_length, __n == (other->raw_message)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((this->raw_message)._M_dataplus._M_p,(other->raw_message)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool ErrorData::operator==(const ErrorData &other) const {
	if (initialized != other.initialized) {
		return false;
	}
	if (type != other.type) {
		return false;
	}
	return raw_message == other.raw_message;
}